

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupFlopClass(Gia_Man_t *p,int iClass)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFlopClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x4d4,"Gia_Man_t *Gia_ManDupFlopClass(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar15 = 0;
    do {
      if ((int)uVar10 <= lVar15) goto LAB_001df67f;
      iVar14 = pVVar9->pArray[lVar15];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_001df660;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df69e;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df69e;
      pGVar3[iVar14].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar9 = p->vCis;
      uVar10 = (ulong)pVVar9->nSize;
    } while (lVar15 < (long)(uVar10 - (long)p->nRegs));
  }
  uVar10 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar15 = 0;
    do {
      iVar14 = p->vCis->nSize;
      uVar10 = (ulong)(uint)(iVar14 - (int)uVar10) + lVar15;
      iVar5 = (int)uVar10;
      if ((iVar5 < 0) || (iVar14 <= iVar5)) goto LAB_001df67f;
      iVar14 = p->vCis->pArray[uVar10 & 0xffffffff];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_001df660;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (p->vFlopClasses->nSize <= lVar15) goto LAB_001df67f;
      if (p->vFlopClasses->pArray[lVar15] != iClass) {
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df69e;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df69e;
        pGVar3[iVar14].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
      }
      lVar15 = lVar15 + 1;
      uVar10 = (ulong)p->nRegs;
    } while (lVar15 < (long)uVar10);
  }
  uVar10 = (ulong)(uint)p->nRegs;
  if (p->nRegs < 1) {
    iVar14 = 0;
  }
  else {
    lVar15 = 0;
    iVar14 = 0;
    do {
      iVar5 = p->vCis->nSize;
      uVar10 = (ulong)(uint)(iVar5 - (int)uVar10) + lVar15;
      iVar11 = (int)uVar10;
      if ((iVar11 < 0) || (iVar5 <= iVar11)) goto LAB_001df67f;
      iVar5 = p->vCis->pArray[uVar10 & 0xffffffff];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001df660;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (p->vFlopClasses->nSize <= lVar15) goto LAB_001df67f;
      if (p->vFlopClasses->pArray[lVar15] == iClass) {
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) {
LAB_001df69e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df69e;
        pGVar3[iVar5].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
        iVar14 = iVar14 + 1;
      }
      lVar15 = lVar15 + 1;
      uVar10 = (ulong)p->nRegs;
    } while (lVar15 < (long)uVar10);
  }
  if (0 < p->nObjs) {
    lVar16 = 8;
    lVar15 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar10 = *(ulong *)((long)pGVar3 + lVar16 + -8);
      if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
        uVar1 = *(uint *)((long)pGVar3 +
                         lVar16 + (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar13 = *(uint *)((long)pGVar3 +
                              lVar16 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar13 < 0)) goto LAB_001df6bd;
        iVar5 = Gia_ManAppendAnd(p_00,uVar1 ^ (uint)(uVar10 >> 0x1d) & 1,
                                 uVar13 ^ (uint)(uVar10 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar16) = iVar5;
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar15 < p->nObjs);
  }
  pVVar9 = p->vCos;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar15 = 0;
    do {
      if ((int)uVar10 <= lVar15) goto LAB_001df67f;
      iVar5 = pVVar9->pArray[lVar15];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001df660;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar5;
      uVar13 = (uint)*(undefined8 *)pGVar3;
      uVar1 = pGVar3[-(ulong)(uVar13 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_001df6bd;
      Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar1);
      lVar15 = lVar15 + 1;
      pVVar9 = p->vCos;
      uVar10 = (ulong)pVVar9->nSize;
    } while (lVar15 < (long)(uVar10 - (long)p->nRegs));
  }
  uVar10 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar15 = 0;
    do {
      iVar5 = p->vCos->nSize;
      uVar10 = (ulong)(uint)(iVar5 - (int)uVar10) + lVar15;
      iVar11 = (int)uVar10;
      if ((iVar11 < 0) || (iVar5 <= iVar11)) goto LAB_001df67f;
      iVar5 = p->vCos->pArray[uVar10 & 0xffffffff];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001df660;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->vFlopClasses->nSize <= lVar15) goto LAB_001df67f;
      if (p->vFlopClasses->pArray[lVar15] != iClass) {
        pGVar3 = p->pObjs + iVar5;
        uVar13 = (uint)*(undefined8 *)pGVar3;
        uVar1 = pGVar3[-(ulong)(uVar13 & 0x1fffffff)].Value;
        if ((int)uVar1 < 0) goto LAB_001df6bd;
        Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar1);
      }
      lVar15 = lVar15 + 1;
      uVar10 = (ulong)p->nRegs;
    } while (lVar15 < (long)uVar10);
  }
  uVar10 = (ulong)(uint)p->nRegs;
  if (p->nRegs < 1) {
    iVar5 = 0;
  }
  else {
    lVar15 = 0;
    iVar5 = 0;
    do {
      iVar11 = p->vCos->nSize;
      uVar10 = (ulong)(uint)(iVar11 - (int)uVar10) + lVar15;
      iVar12 = (int)uVar10;
      if ((iVar12 < 0) || (iVar11 <= iVar12)) {
LAB_001df67f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = p->vCos->pArray[uVar10 & 0xffffffff];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) {
LAB_001df660:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->vFlopClasses->nSize <= lVar15) goto LAB_001df67f;
      if (p->vFlopClasses->pArray[lVar15] == iClass) {
        pGVar3 = p->pObjs + iVar11;
        uVar13 = (uint)*(undefined8 *)pGVar3;
        uVar1 = pGVar3[-(ulong)(uVar13 & 0x1fffffff)].Value;
        if ((int)uVar1 < 0) {
LAB_001df6bd:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar1);
        iVar5 = iVar5 + 1;
      }
      lVar15 = lVar15 + 1;
      uVar10 = (ulong)p->nRegs;
    } while (lVar15 < (long)uVar10);
  }
  if (iVar14 != iVar5) {
    __assert_fail("Counter1 == Counter2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x4ec,"Gia_Man_t *Gia_ManDupFlopClass(Gia_Man_t *, int)");
  }
  Gia_ManSetRegNum(p_00,iVar14);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFlopClass( Gia_Man_t * p, int iClass )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i, Counter1 = 0, Counter2 = 0;
    assert( p->vFlopClasses != NULL );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) != iClass )
            pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) == iClass )
            pObj->Value = Gia_ManAppendCi( pNew ), Counter1++;
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) != iClass )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) == iClass )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ), Counter2++;
    assert( Counter1 == Counter2 );
    Gia_ManSetRegNum( pNew, Counter1 );
    return pNew;
}